

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O3

bool picojson::
     _parse<picojson::default_parse_context,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               (default_parse_context *ctx,
               input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *in)

{
  byte *pbVar1;
  int *piVar2;
  intmax_t i;
  byte bVar3;
  uint uVar4;
  size_t sVar5;
  bool bVar6;
  double f;
  string num_str;
  char *endp;
  string local_58;
  char *local_38;
  
  input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::skip_ws(in);
  pbVar1 = (byte *)(in->cur_)._M_current;
  if (in->consumed_ == true) {
    if (*pbVar1 == 10) {
      in->line_ = in->line_ + 1;
    }
    pbVar1 = pbVar1 + 1;
    (in->cur_)._M_current = (char *)pbVar1;
  }
  if (pbVar1 == (byte *)(in->end_)._M_current) {
    in->consumed_ = false;
    uVar4 = 0xffffffff;
  }
  else {
    in->consumed_ = true;
    bVar3 = *pbVar1;
    uVar4 = (uint)bVar3;
    if (bVar3 < 0x6e) {
      if (uVar4 == 0x22) {
        bVar6 = default_parse_context::
                parse_string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(ctx,in)
        ;
        return bVar6;
      }
      if (uVar4 == 0x5b) {
        bVar6 = default_parse_context::parse_array_start(ctx);
        if (!bVar6) {
          return false;
        }
        bVar6 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::expect(in,0x5d);
        if (!bVar6) {
          sVar5 = 0;
          do {
            bVar6 = default_parse_context::
                    parse_array_item<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                              (ctx,in,sVar5);
            if (!bVar6) {
              return false;
            }
            sVar5 = sVar5 + 1;
            bVar6 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::expect(in,0x2c);
          } while (bVar6);
          bVar6 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::expect(in,0x5d);
          return bVar6;
        }
        return true;
      }
      bVar6 = uVar4 == 0x66;
      uVar4 = (uint)bVar3;
      if (bVar6) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        local_58.field_2._M_allocated_capacity._0_4_ = 0x65736c61;
        local_58._M_string_length = 4;
        local_58.field_2._M_allocated_capacity._4_4_ =
             local_58.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
        bVar6 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::match(in,&local_58);
        if (!bVar6) goto LAB_001081b5;
        bVar6 = default_parse_context::set_bool(ctx,false);
        goto LAB_00108194;
      }
    }
    else {
      if (bVar3 == 0x7b) {
        bVar6 = _parse_object<picojson::default_parse_context,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                          (ctx,in);
        return bVar6;
      }
      if (uVar4 == 0x74) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        local_58.field_2._M_allocated_capacity._0_4_ = 0x657572;
        local_58._M_string_length = 3;
        bVar6 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::match(in,&local_58);
        if (!bVar6) {
LAB_001081b5:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p == &local_58.field_2) {
            return false;
          }
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                                   local_58.field_2._M_allocated_capacity._0_4_) + 1);
          return false;
        }
        bVar6 = default_parse_context::set_bool(ctx,true);
LAB_00108194:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                                   local_58.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if (bVar6 == false) {
          return false;
        }
        return true;
      }
      if (uVar4 == 0x6e) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        local_58.field_2._M_allocated_capacity._0_4_ = 0x6c6c75;
        local_58._M_string_length = 3;
        bVar6 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::match(in,&local_58);
        if (!bVar6) goto LAB_001081b5;
        bVar6 = default_parse_context::set_null(ctx);
        goto LAB_00108194;
      }
    }
  }
  if (uVar4 != 0x2d && 9 < uVar4 - 0x30) {
    in->consumed_ = false;
    return false;
  }
  bVar3 = 0;
  in->consumed_ = false;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity._0_4_ =
       local_58.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  while( true ) {
    if ((bVar3 & 1) != 0) {
      if (*pbVar1 == 10) {
        in->line_ = in->line_ + 1;
      }
      pbVar1 = pbVar1 + 1;
      (in->cur_)._M_current = (char *)pbVar1;
    }
    if (pbVar1 == (byte *)(in->end_)._M_current) break;
    in->consumed_ = true;
    if (*pbVar1 - 0x30 < 10) {
LAB_00107fbf:
      std::__cxx11::string::push_back((char)&local_58);
    }
    else {
      uVar4 = *pbVar1 - 0x2b;
      if (0x3a < uVar4) goto LAB_0010804d;
      if ((0x400000004000005U >> ((ulong)uVar4 & 0x3f) & 1) != 0) goto LAB_00107fbf;
      if ((ulong)uVar4 != 3) goto LAB_0010804d;
      localeconv();
      std::__cxx11::string::append((char *)&local_58);
    }
    bVar3 = in->consumed_;
    pbVar1 = (byte *)(in->cur_)._M_current;
  }
  in->consumed_ = false;
LAB_0010804d:
  in->consumed_ = false;
  if (local_58._M_string_length != 0) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    i = strtoimax(local_58._M_dataplus._M_p,&local_38,10);
    if ((*piVar2 == 0) && (local_38 == local_58._M_dataplus._M_p + local_58._M_string_length)) {
      bVar6 = true;
      default_parse_context::set_int64(ctx,i);
      goto LAB_001081ea;
    }
    f = strtod(local_58._M_dataplus._M_p,&local_38);
    if (local_38 == local_58._M_dataplus._M_p + local_58._M_string_length) {
      bVar6 = true;
      default_parse_context::set_number(ctx,f);
      goto LAB_001081ea;
    }
  }
  bVar6 = false;
LAB_001081ea:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                             local_58.field_2._M_allocated_capacity._0_4_) + 1);
    return bVar6;
  }
  return bVar6;
}

Assistant:

inline bool _parse(Context &ctx, input<Iter> &in) {
  in.skip_ws();
  int ch = in.getc();
  switch (ch) {
#define IS(ch, text, op)                                                                                                           \
  case ch:                                                                                                                         \
    if (in.match(text) && op) {                                                                                                    \
      return true;                                                                                                                 \
    } else {                                                                                                                       \
      return false;                                                                                                                \
    }
    IS('n', "ull", ctx.set_null());
    IS('f', "alse", ctx.set_bool(false));
    IS('t', "rue", ctx.set_bool(true));
#undef IS
  case '"':
    return ctx.parse_string(in);
  case '[':
    return _parse_array(ctx, in);
  case '{':
    return _parse_object(ctx, in);
  default:
    if (('0' <= ch && ch <= '9') || ch == '-') {
      double f;
      char *endp;
      in.ungetc();
      std::string num_str(_parse_number(in));
      if (num_str.empty()) {
        return false;
      }
#ifdef PICOJSON_USE_INT64
      {
        errno = 0;
        intmax_t ival = strtoimax(num_str.c_str(), &endp, 10);
        if (errno == 0 && std::numeric_limits<int64_t>::min() <= ival && ival <= std::numeric_limits<int64_t>::max() &&
            endp == num_str.c_str() + num_str.size()) {
          ctx.set_int64(ival);
          return true;
        }
      }
#endif
      f = strtod(num_str.c_str(), &endp);
      if (endp == num_str.c_str() + num_str.size()) {
        ctx.set_number(f);
        return true;
      }
      return false;
    }
    break;
  }
  in.ungetc();
  return false;
}